

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InterfacePortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InterfacePortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  InterfacePortSymbol *pIVar4;
  
  pIVar4 = (InterfacePortSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InterfacePortSymbol *)this->endPtr < pIVar4 + 1) {
    pIVar4 = (InterfacePortSymbol *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pIVar4 + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  (pIVar4->super_Symbol).kind = InterfacePort;
  (pIVar4->super_Symbol).name._M_len = sVar2;
  (pIVar4->super_Symbol).name._M_str = pcVar3;
  (pIVar4->super_Symbol).location = SVar1;
  (pIVar4->super_Symbol).parentScope = (Scope *)0x0;
  (pIVar4->super_Symbol).nextInScope = (Symbol *)0x0;
  (pIVar4->super_Symbol).indexInScope = 0;
  (pIVar4->range).
  super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
  _M_engaged = false;
  (pIVar4->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  pIVar4->interfaceDef = (DefinitionSymbol *)0x0;
  (pIVar4->modport)._M_len = 0;
  (pIVar4->modport)._M_str = (char *)0x0;
  pIVar4->isGeneric = false;
  return pIVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }